

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

int VP8LGetHistoImageSymbols
              (int xsize,int ysize,VP8LBackwardRefs *refs,int quality,int low_effort,
              int histogram_bits,int cache_bits,VP8LHistogramSet *image_histo,
              VP8LHistogram *tmp_histo,uint32_t *histogram_symbols,WebPPicture *pic,
              int percent_range,int *percent)

{
  undefined8 *puVar1;
  uint64_t *puVar2;
  ushort uVar3;
  int iVar4;
  VP8LHistogram **ppVVar5;
  VP8LHistogram **ppVVar6;
  VP8LHistogram *pVVar7;
  uint32_t *__dest;
  ulong uVar8;
  ulong uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  undefined8 uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  PixOrCopy *pPVar17;
  int iVar18;
  uint uVar19;
  uint idx1;
  int iVar20;
  VP8LHistogramSet *set;
  ulong uVar21;
  VP8LHistogram *pVVar22;
  int64_t iVar23;
  byte bVar24;
  ulong uVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  int iVar30;
  uint uVar31;
  ulong uVar32;
  long lVar33;
  WebPPicture *pWVar34;
  short sVar35;
  int iVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  PixOrCopy *v;
  int iVar46;
  uint uVar47;
  int iVar48;
  HistogramPair *pHVar49;
  short sVar50;
  uint16_t uVar51;
  int64_t iVar52;
  uint uVar53;
  bool bVar54;
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  VP8LHistogram **local_1c0;
  ulong local_1a0;
  VP8LHistogram *local_180;
  uint64_t costs [5];
  uint64_t bit_cost;
  VP8LRefsCursor local_138;
  uint64_t uStack_120;
  uint64_t local_118;
  uint64_t uStack_110;
  uint64_t local_108;
  uint64_t uStack_100;
  
  bVar24 = (byte)histogram_bits;
  if (histogram_bits == 0) {
    iVar26 = 1;
  }
  else {
    iVar26 = 1 << (bVar24 & 0x1f);
    iVar26 = ((ysize + iVar26) - 1U >> (bVar24 & 0x1f)) * ((xsize + iVar26) - 1U >> (bVar24 & 0x1f))
    ;
  }
  set = VP8LAllocateHistogramSet(iVar26,cache_bits);
  lVar37 = 0x40;
  if (low_effort != 0) {
    lVar37 = 4;
  }
  if (set == (VP8LHistogramSet *)0x0) {
LAB_0013c5ac:
    WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else {
    local_1a0 = 1;
    local_180 = tmp_histo;
    ppVVar5 = set->histograms;
    VP8LRefsCursorInit(&local_138,refs);
    VP8LHistogramSetClear(set);
    iVar46 = 0;
    iVar18 = 0;
    while (pPVar17 = local_138.cur_pos, local_138.cur_pos != (PixOrCopy *)0x0) {
      HistogramAddSinglePixOrCopy
                (ppVVar5[(int)((iVar18 >> (bVar24 & 0x1f)) +
                              (iVar46 >> (bVar24 & 0x1f)) *
                              ((xsize + (1 << (bVar24 & 0x1f))) - 1U >> (bVar24 & 0x1f)))],
                 local_138.cur_pos,(_func_int_int_int *)0x0,0);
      iVar18 = iVar18 + (uint)pPVar17->len;
      while (xsize <= iVar18) {
        iVar46 = iVar46 + 1;
        iVar18 = iVar18 - xsize;
      }
      VP8LRefsCursorNext(&local_138);
    }
    ppVVar5 = set->histograms;
    ppVVar6 = image_histo->histograms;
    image_histo->size = 0;
    for (uVar32 = (ulong)(0 >> (bVar24 & 0x1f)); (long)uVar32 < (long)set->max_size;
        uVar32 = uVar32 + 1) {
      pVVar22 = ppVVar5[uVar32];
      ComputeHistogramCost(pVVar22);
      if ((((pVVar22->is_used[0] == '\0') && (pVVar22->is_used[1] == '\0')) &&
          (pVVar22->is_used[2] == '\0')) &&
         ((pVVar22->is_used[3] == '\0' && (pVVar22->is_used[4] == '\0')))) {
        ppVVar5[uVar32] = (VP8LHistogram *)0x0;
      }
      else {
        pVVar7 = ppVVar6[image_histo->size];
        iVar18 = pVVar7->palette_code_bits;
        iVar36 = (1 << ((byte)iVar18 & 0x1f)) + 0x118;
        iVar46 = (4 << ((byte)iVar18 & 0x1f)) + 0x1150;
        if (iVar18 < 1) {
          iVar36 = 0x118;
        }
        __dest = pVVar7->literal;
        if (iVar18 < 1) {
          iVar46 = 0x1150;
        }
        memcpy(pVVar7,pVVar22,(long)iVar46);
        pVVar7->literal = __dest;
        memcpy(__dest,pVVar22->literal,(long)iVar36 << 2);
        image_histo->size = image_histo->size + 1;
      }
    }
    uVar47 = image_histo->size;
    uVar31 = (int)lVar37 * 2;
    if (quality < 100 &&
        (uVar47 != uVar31 && SBORROW4(uVar47,uVar31) == (int)(uVar47 + (int)lVar37 * -2) < 0)) {
      if (quality < 0x5a) {
        uVar32 = (ulong)((((uint)(iVar26 < 0x101) * 8 + 8 >> (0x200 < iVar26)) >> (0x400 < iVar26))
                        >> (quality < 0x33));
      }
      else {
        uVar32 = 0x10;
      }
      ppVVar5 = image_histo->histograms;
      uVar42 = 0;
      uVar21 = 0;
      if (0 < (int)uVar47) {
        uVar21 = (ulong)uVar47;
      }
      uVar25 = 0xffffffffffffffff;
      uVar28 = 0;
      uVar39 = 0;
      uVar41 = 0;
      uVar38 = uVar25;
      uVar40 = uVar25;
      for (; uVar21 != uVar42; uVar42 = uVar42 + 1) {
        pVVar22 = ppVVar5[uVar42];
        uVar8 = pVVar22->costs[0];
        if (uVar41 <= uVar8) {
          uVar41 = uVar8;
        }
        uVar9 = pVVar22->costs[1];
        if (uVar8 <= uVar40) {
          uVar40 = uVar8;
        }
        if (uVar39 <= uVar9) {
          uVar39 = uVar9;
        }
        if (uVar9 <= uVar38) {
          uVar38 = uVar9;
        }
        uVar8 = pVVar22->costs[2];
        if (uVar28 <= uVar8) {
          uVar28 = uVar8;
        }
        if (uVar8 <= uVar25) {
          uVar25 = uVar8;
        }
      }
      lVar43 = uVar41 - uVar40;
      auVar56._8_4_ = (int)((ulong)lVar43 >> 0x20);
      auVar56._0_8_ = lVar43;
      auVar56._12_4_ = 0x45300000;
      lVar44 = uVar39 - uVar38;
      auVar57._8_4_ = (int)((ulong)lVar44 >> 0x20);
      auVar57._0_8_ = lVar44;
      auVar57._12_4_ = 0x45300000;
      lVar45 = uVar28 - uVar25;
      auVar58._8_4_ = (int)((ulong)lVar45 >> 0x20);
      auVar58._0_8_ = lVar45;
      auVar58._12_4_ = 0x45300000;
      for (uVar42 = 0; uVar21 != uVar42; uVar42 = uVar42 + 1) {
        uVar51 = 0;
        pVVar22 = ppVVar5[uVar42];
        if (uVar41 != uVar40) {
          lVar33 = pVVar22->costs[0] - uVar40;
          auVar59._8_4_ = (int)((ulong)lVar33 >> 0x20);
          auVar59._0_8_ = lVar33;
          auVar59._12_4_ = 0x45300000;
          uVar51 = (uint16_t)
                   (int)((((auVar59._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar33) - 4503599627370496.0)) *
                         3.999999) /
                        ((auVar56._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar43) - 4503599627370496.0)));
        }
        if (low_effort == 0) {
          sVar35 = 0;
          sVar50 = 0;
          if (uVar39 != uVar38) {
            lVar33 = pVVar22->costs[1] - uVar38;
            auVar60._8_4_ = (int)((ulong)lVar33 >> 0x20);
            auVar60._0_8_ = lVar33;
            auVar60._12_4_ = 0x45300000;
            sVar50 = (short)((int)((((auVar60._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)lVar33) - 4503599627370496.0))
                                   * 3.999999) /
                                  ((auVar57._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar44) - 4503599627370496.0)))
                            << 2);
          }
          if (uVar28 != uVar25) {
            lVar33 = pVVar22->costs[2] - uVar25;
            auVar61._8_4_ = (int)((ulong)lVar33 >> 0x20);
            auVar61._0_8_ = lVar33;
            auVar61._12_4_ = 0x45300000;
            sVar35 = (short)(int)((((auVar61._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar33) - 4503599627370496.0))
                                  * 3.999999) /
                                 ((auVar58._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)lVar45) - 4503599627370496.0)));
          }
          uVar51 = sVar50 + uVar51 * 0x10 + sVar35;
        }
        pVVar22->bin_id = uVar51;
      }
      for (lVar43 = 0; lVar37 != lVar43; lVar43 = lVar43 + 1) {
        *(undefined4 *)((long)&local_138.cur_pos + lVar43 * 4) = 0xffff;
      }
      iVar26 = 0;
      while (iVar26 < (int)uVar47) {
        pVVar22 = ppVVar5[iVar26];
        uVar21 = (ulong)pVVar22->bin_id;
        lVar37 = (long)*(short *)((long)&local_138.cur_pos + uVar21 * 4);
        if (lVar37 == -1) {
          *(short *)((long)&local_138.cur_pos + uVar21 * 4) = (short)iVar26;
LAB_0013bc05:
          iVar26 = iVar26 + 1;
        }
        else if (low_effort == 0) {
          lVar44 = pVVar22->bit_cost * uVar32;
          lVar43 = lVar44 + 0x32;
          if (lVar44 < 0) {
            lVar43 = lVar44 + -0x32;
          }
          pVVar7 = ppVVar5[lVar37];
          lVar33 = pVVar22->bit_cost + pVVar7->bit_cost;
          lVar45 = lVar43 / -100 + lVar33;
          lVar44 = lVar45;
          if (0x7fffffffffffffff - lVar43 / -100 < lVar33) {
            lVar44 = 0x7fffffffffffffff;
          }
          if (99 < lVar43) {
            lVar44 = lVar45;
          }
          iVar18 = GetCombinedHistogramEntropy(pVVar7,pVVar22,lVar44,&bit_cost,costs);
          if (iVar18 == 0) {
            iVar26 = iVar26 + 1;
          }
          else {
            HistogramAdd(pVVar7,pVVar22,local_180);
            UpdateHistogramCost(bit_cost,costs,local_180);
            if (((local_180->trivial_symbol[1] == 0xffff) ||
                (local_180->trivial_symbol[2] == 0xffff)) ||
               (local_180->trivial_symbol[3] == 0xffff)) {
              pVVar22 = ppVVar5[iVar26];
              bVar55 = true;
              bVar54 = bVar55;
              if ((pVVar22->trivial_symbol[1] != 0xffff) && (pVVar22->trivial_symbol[2] != 0xffff))
              {
                bVar54 = pVVar22->trivial_symbol[3] == 0xffff;
              }
              pVVar22 = ppVVar5[lVar37];
              if ((pVVar22->trivial_symbol[1] != 0xffff) && (pVVar22->trivial_symbol[2] != 0xffff))
              {
                bVar55 = pVVar22->trivial_symbol[3] == 0xffff;
              }
              if ((!(bool)(bVar55 & bVar54)) &&
                 (uVar3 = *(ushort *)((long)&local_138.cur_pos + uVar21 * 4 + 2), uVar3 < 0x20)) {
                *(ushort *)((long)&local_138.cur_pos + uVar21 * 4 + 2) = uVar3 + 1;
                goto LAB_0013bc05;
              }
            }
            else {
              pVVar22 = ppVVar5[lVar37];
            }
            ppVVar5[lVar37] = local_180;
            iVar18 = image_histo->size;
            image_histo->histograms[iVar26] = image_histo->histograms[(long)iVar18 + -1];
            image_histo->size = iVar18 + -1;
            local_180 = pVVar22;
          }
        }
        else {
          HistogramAdd(pVVar22,ppVVar5[lVar37],ppVVar5[lVar37]);
          iVar18 = image_histo->size;
          image_histo->histograms[iVar26] = image_histo->histograms[(long)iVar18 + -1];
          image_histo->size = iVar18 + -1;
        }
        uVar47 = image_histo->size;
      }
      if (low_effort == 0) goto LAB_0013bded;
      for (lVar37 = 0; lVar37 < (int)uVar47; lVar37 = lVar37 + 1) {
        ComputeHistogramCost(ppVVar5[lVar37]);
        uVar47 = image_histo->size;
      }
    }
    else {
LAB_0013bded:
      iVar26 = quality * quality * quality;
      lVar43 = (long)(iVar26 * 99);
      lVar37 = lVar43 + -500000;
      if (-1 < iVar26) {
        lVar37 = lVar43 + 500000;
      }
      local_1c0 = image_histo->histograms;
      iVar26 = (int)(lVar37 / 1000000);
      if (iVar26 < (int)uVar47) {
        iVar18 = HistoQueueInit((HistoQueue *)costs,9);
        pWVar34 = pic;
        if (iVar18 != 0) {
          uVar53 = 0;
          uVar31 = uVar47;
          if ((int)uVar47 < 1) {
            uVar31 = uVar53;
          }
          uVar19 = 0;
          while (((iVar46 = image_histo->size, uVar19 != uVar31 && (iVar26 < iVar46)) &&
                 (uVar53 = uVar53 + 1, (int)uVar53 < (int)uVar47 / 2))) {
            if ((int)costs[1] == 0) {
              iVar52 = 0;
            }
            else {
              iVar52 = *(int64_t *)(costs[0] + 8);
            }
            uVar29 = (iVar46 + -1) * iVar46;
            iVar36 = iVar46 / 2;
            for (iVar48 = 0; (1 < iVar46 && (iVar48 < iVar36)); iVar48 = iVar48 + 1) {
              local_1a0 = (local_1a0 * 0xbc8f) % 0x7fffffff;
              uVar32 = local_1a0 % (ulong)uVar29;
              uVar27 = (uint)(uVar32 % (ulong)(iVar46 - 1));
              idx1 = (uint)(uVar32 / (iVar46 - 1));
              iVar23 = HistoQueuePush((HistoQueue *)costs,local_1c0,idx1,
                                      (uVar27 + 1) - (uint)(uVar27 < idx1),iVar52);
              if ((iVar23 < 0) && ((int)costs[1] == costs[1]._4_4_)) break;
              if (iVar23 < 0) {
                iVar52 = iVar23;
              }
              iVar46 = image_histo->size;
            }
            iVar46 = (int)costs[1];
            uVar16 = costs[0];
            if ((int)costs[1] != 0) {
              iVar36 = *(int *)costs[0];
              iVar48 = *(int *)(costs[0] + 4);
              HistogramAdd(local_1c0[iVar48],local_1c0[iVar36],local_1c0[iVar36]);
              UpdateHistogramCost(*(uint64_t *)(uVar16 + 0x10),(uint64_t *)(uVar16 + 0x18),
                                  local_1c0[iVar36]);
              iVar30 = image_histo->size;
              image_histo->histograms[iVar48] = image_histo->histograms[(long)iVar30 + -1];
              image_histo->size = iVar30 + -1;
              iVar30 = 0;
              do {
                pHVar49 = (HistogramPair *)((long)iVar30 * 0x40 + uVar16);
                while( true ) {
                  if (iVar46 <= iVar30) {
                    uVar53 = 0;
                    costs[1]._0_4_ = iVar46;
                    goto LAB_0013c15e;
                  }
                  iVar20 = pHVar49->idx1;
                  iVar4 = pHVar49->idx2;
                  if ((iVar20 == iVar48 || iVar20 == iVar36) && (iVar4 == iVar48 || iVar4 == iVar36)
                     ) break;
                  if ((iVar20 == iVar48 || iVar20 == iVar36) || (iVar4 == iVar48 || iVar4 == iVar36)
                     ) {
                    HistoQueueFixPair(iVar48,iVar36,pHVar49);
                    iVar20 = HistoQueueUpdatePair
                                       (local_1c0[pHVar49->idx1],local_1c0[pHVar49->idx2],0,pHVar49)
                    ;
                    if (iVar20 == 0) break;
                  }
                  HistoQueueFixPair(image_histo->size,iVar48,pHVar49);
                  if (pHVar49->cost_diff < *(long *)(uVar16 + 8)) {
                    local_138.cur_pos = *(PixOrCopy **)uVar16;
                    local_138.cur_block = *(PixOrCopyBlock **)(uVar16 + 8);
                    local_138.last_pos = *(PixOrCopy **)(uVar16 + 0x10);
                    uStack_120 = *(uint64_t *)(uVar16 + 0x18);
                    local_118 = *(uint64_t *)(uVar16 + 0x20);
                    uStack_110 = *(uint64_t *)(uVar16 + 0x28);
                    local_108 = *(uint64_t *)(uVar16 + 0x30);
                    uStack_100 = *(uint64_t *)(uVar16 + 0x38);
                    uVar12 = *(undefined8 *)pHVar49;
                    iVar52 = pHVar49->cost_diff;
                    uVar10 = pHVar49->cost_combo;
                    uVar11 = pHVar49->costs[0];
                    uVar13 = pHVar49->costs[1];
                    uVar14 = pHVar49->costs[2];
                    uVar15 = pHVar49->costs[4];
                    *(uint64_t *)(uVar16 + 0x30) = pHVar49->costs[3];
                    *(uint64_t *)(uVar16 + 0x38) = uVar15;
                    *(uint64_t *)(uVar16 + 0x20) = uVar13;
                    *(uint64_t *)(uVar16 + 0x28) = uVar14;
                    *(uint64_t *)(uVar16 + 0x10) = uVar10;
                    *(uint64_t *)(uVar16 + 0x18) = uVar11;
                    *(undefined8 *)uVar16 = uVar12;
                    *(int64_t *)(uVar16 + 8) = iVar52;
                    pHVar49->costs[3] = local_108;
                    pHVar49->costs[4] = uStack_100;
                    pHVar49->costs[1] = local_118;
                    pHVar49->costs[2] = uStack_110;
                    pHVar49->cost_combo = (uint64_t)local_138.last_pos;
                    pHVar49->costs[0] = uStack_120;
                    *(PixOrCopy **)pHVar49 = local_138.cur_pos;
                    pHVar49->cost_diff = (int64_t)local_138.cur_block;
                  }
                  iVar30 = iVar30 + 1;
                  pHVar49 = pHVar49 + 1;
                }
                lVar37 = (long)iVar46 * 0x40;
                puVar1 = (undefined8 *)((uVar16 - 0x40) + lVar37);
                uVar12 = *puVar1;
                iVar52 = puVar1[1];
                puVar2 = (uint64_t *)((uVar16 - 0x30) + lVar37);
                uVar13 = *puVar2;
                uVar14 = puVar2[1];
                puVar2 = (uint64_t *)((uVar16 - 0x20) + lVar37);
                uVar10 = *puVar2;
                uVar11 = puVar2[1];
                puVar2 = (uint64_t *)((uVar16 - 0x10) + lVar37);
                uVar15 = puVar2[1];
                pHVar49->costs[3] = *puVar2;
                pHVar49->costs[4] = uVar15;
                pHVar49->costs[1] = uVar10;
                pHVar49->costs[2] = uVar11;
                pHVar49->cost_combo = uVar13;
                pHVar49->costs[0] = uVar14;
                pHVar49->idx1 = (int)uVar12;
                pHVar49->idx2 = (int)((ulong)uVar12 >> 0x20);
                pHVar49->cost_diff = iVar52;
                iVar46 = iVar46 + -1;
              } while( true );
            }
LAB_0013c15e:
            uVar19 = uVar19 + 1;
          }
          pWVar34 = (WebPPicture *)(ulong)(iVar26 + 1 < iVar46);
        }
        WebPSafeFree((void *)costs[0]);
        if (iVar18 == 0) goto LAB_0013c5ac;
        uVar47 = image_histo->size;
        if (((ulong)pWVar34 & 1) != 0) goto LAB_0013c40d;
        local_1c0 = image_histo->histograms;
      }
      iVar26 = HistoQueueInit((HistoQueue *)costs,uVar47 * uVar47);
      if (iVar26 == 0) {
        WebPSafeFree((void *)costs[0]);
        goto LAB_0013c5ac;
      }
      uVar31 = 0;
      if (0 < (int)uVar47) {
        uVar31 = uVar47;
      }
      uVar53 = 0;
      while (uVar19 = uVar53, uVar19 != uVar31) {
        for (uVar29 = uVar19 + 1; uVar53 = uVar19 + 1, (int)uVar29 < (int)uVar47;
            uVar29 = uVar29 + 1) {
          HistoQueuePush((HistoQueue *)costs,local_1c0,uVar19,uVar29,0);
        }
      }
      while (iVar26 = (int)costs[1], uVar16 = costs[0], 0 < (int)costs[1]) {
        iVar18 = *(int *)costs[0];
        iVar46 = *(int *)(costs[0] + 4);
        HistogramAdd(local_1c0[iVar46],local_1c0[iVar18],local_1c0[iVar18]);
        UpdateHistogramCost(*(uint64_t *)(uVar16 + 0x10),(uint64_t *)(uVar16 + 0x18),
                            local_1c0[iVar18]);
        iVar36 = image_histo->size;
        image_histo->histograms[iVar46] = image_histo->histograms[(long)iVar36 + -1];
        image_histo->size = iVar36 + -1;
        iVar36 = 0;
LAB_0013c264:
        pHVar49 = (HistogramPair *)((long)iVar36 * 0x40 + uVar16);
        for (; iVar36 < iVar26; iVar36 = iVar36 + 1) {
          if ((((pHVar49->idx1 == iVar18) || (pHVar49->idx2 == iVar46)) || (pHVar49->idx1 == iVar46)
              ) || (pHVar49->idx2 == iVar18)) goto LAB_0013c36f;
          HistoQueueFixPair(image_histo->size,iVar46,pHVar49);
          if (pHVar49->cost_diff < *(long *)(uVar16 + 8)) {
            local_138.cur_pos = *(PixOrCopy **)uVar16;
            local_138.cur_block = *(PixOrCopyBlock **)(uVar16 + 8);
            local_138.last_pos = *(PixOrCopy **)(uVar16 + 0x10);
            uStack_120 = *(uint64_t *)(uVar16 + 0x18);
            local_118 = *(uint64_t *)(uVar16 + 0x20);
            uStack_110 = *(uint64_t *)(uVar16 + 0x28);
            local_108 = *(uint64_t *)(uVar16 + 0x30);
            uStack_100 = *(uint64_t *)(uVar16 + 0x38);
            uVar12 = *(undefined8 *)pHVar49;
            iVar52 = pHVar49->cost_diff;
            uVar10 = pHVar49->cost_combo;
            uVar11 = pHVar49->costs[0];
            uVar13 = pHVar49->costs[1];
            uVar14 = pHVar49->costs[2];
            uVar15 = pHVar49->costs[4];
            *(uint64_t *)(uVar16 + 0x30) = pHVar49->costs[3];
            *(uint64_t *)(uVar16 + 0x38) = uVar15;
            *(uint64_t *)(uVar16 + 0x20) = uVar13;
            *(uint64_t *)(uVar16 + 0x28) = uVar14;
            *(uint64_t *)(uVar16 + 0x10) = uVar10;
            *(uint64_t *)(uVar16 + 0x18) = uVar11;
            *(undefined8 *)uVar16 = uVar12;
            *(int64_t *)(uVar16 + 8) = iVar52;
            pHVar49->costs[3] = local_108;
            pHVar49->costs[4] = uStack_100;
            pHVar49->costs[1] = local_118;
            pHVar49->costs[2] = uStack_110;
            pHVar49->cost_combo = (uint64_t)local_138.last_pos;
            pHVar49->costs[0] = uStack_120;
            *(PixOrCopy **)pHVar49 = local_138.cur_pos;
            pHVar49->cost_diff = (int64_t)local_138.cur_block;
          }
          pHVar49 = pHVar49 + 1;
        }
        costs[1]._0_4_ = iVar26;
        for (iVar46 = 0; iVar46 < image_histo->size; iVar46 = iVar46 + 1) {
          if (iVar18 != iVar46) {
            HistoQueuePush((HistoQueue *)costs,image_histo->histograms,iVar18,iVar46,0);
          }
        }
      }
      WebPSafeFree((void *)costs[0]);
      uVar47 = image_histo->size;
    }
LAB_0013c40d:
    ppVVar5 = set->histograms;
    ppVVar6 = image_histo->histograms;
    uVar32 = 0;
    if (0 < image_histo->max_size) {
      uVar32 = (ulong)(uint)image_histo->max_size;
    }
    if ((int)uVar47 < 2) {
      for (uVar21 = 0; uVar32 != uVar21; uVar21 = uVar21 + 1) {
        histogram_symbols[uVar21] = 0;
      }
    }
    else {
      for (uVar21 = 0; uVar21 != uVar32; uVar21 = uVar21 + 1) {
        if (ppVVar5[uVar21] == (VP8LHistogram *)0x0) {
          histogram_symbols[uVar21] = histogram_symbols[uVar21 - 1];
        }
        else {
          uVar25 = 0;
          lVar37 = 0x7fffffffffffffff;
          for (uVar42 = 0; uVar47 != uVar42; uVar42 = uVar42 + 1) {
            pVVar22 = ppVVar6[uVar42];
            lVar43 = pVVar22->bit_cost + lVar37;
            lVar44 = lVar43;
            if (0x7fffffffffffffff - lVar37 < (long)pVVar22->bit_cost) {
              lVar44 = 0x7fffffffffffffff;
            }
            if (lVar37 < 0) {
              lVar44 = lVar43;
            }
            iVar26 = GetCombinedHistogramEntropy
                               (pVVar22,ppVVar5[uVar21],lVar44,costs,(uint64_t *)&local_138);
            if (iVar26 != 0) {
              lVar37 = costs[0] - pVVar22->bit_cost;
              uVar25 = uVar42 & 0xffffffff;
            }
          }
          histogram_symbols[uVar21] = (uint32_t)uVar25;
        }
      }
    }
    VP8LHistogramSetClear(image_histo);
    image_histo->size = uVar47;
    for (uVar21 = 0; uVar32 != uVar21; uVar21 = uVar21 + 1) {
      if (ppVVar5[uVar21] != (VP8LHistogram *)0x0) {
        pVVar22 = ppVVar6[(int)histogram_symbols[uVar21]];
        HistogramAdd(ppVVar5[uVar21],pVVar22,pVVar22);
      }
    }
    WebPReportProgress(pic,percent_range + *percent,percent);
  }
  WebPSafeFree(set);
  return (int)(pic->error_code == VP8_ENC_OK);
LAB_0013c36f:
  lVar37 = (long)iVar26 * 0x40;
  puVar1 = (undefined8 *)((uVar16 - 0x40) + lVar37);
  uVar12 = *puVar1;
  iVar52 = puVar1[1];
  puVar2 = (uint64_t *)((uVar16 - 0x30) + lVar37);
  uVar13 = *puVar2;
  uVar14 = puVar2[1];
  puVar2 = (uint64_t *)((uVar16 - 0x20) + lVar37);
  uVar10 = *puVar2;
  uVar11 = puVar2[1];
  puVar2 = (uint64_t *)((uVar16 - 0x10) + lVar37);
  uVar15 = puVar2[1];
  pHVar49->costs[3] = *puVar2;
  pHVar49->costs[4] = uVar15;
  pHVar49->costs[1] = uVar10;
  pHVar49->costs[2] = uVar11;
  pHVar49->cost_combo = uVar13;
  pHVar49->costs[0] = uVar14;
  pHVar49->idx1 = (int)uVar12;
  pHVar49->idx2 = (int)((ulong)uVar12 >> 0x20);
  pHVar49->cost_diff = iVar52;
  iVar26 = iVar26 + -1;
  goto LAB_0013c264;
}

Assistant:

int VP8LGetHistoImageSymbols(int xsize, int ysize,
                             const VP8LBackwardRefs* const refs, int quality,
                             int low_effort, int histogram_bits, int cache_bits,
                             VP8LHistogramSet* const image_histo,
                             VP8LHistogram* const tmp_histo,
                             uint32_t* const histogram_symbols,
                             const WebPPicture* const pic, int percent_range,
                             int* const percent) {
  const int histo_xsize =
      histogram_bits ? VP8LSubSampleSize(xsize, histogram_bits) : 1;
  const int histo_ysize =
      histogram_bits ? VP8LSubSampleSize(ysize, histogram_bits) : 1;
  const int image_histo_raw_size = histo_xsize * histo_ysize;
  VP8LHistogramSet* const orig_histo =
      VP8LAllocateHistogramSet(image_histo_raw_size, cache_bits);
  // Don't attempt linear bin-partition heuristic for
  // histograms of small sizes (as bin_map will be very sparse) and
  // maximum quality q==100 (to preserve the compression gains at that level).
  const int entropy_combine_num_bins = low_effort ? NUM_PARTITIONS : BIN_SIZE;
  int entropy_combine;
  if (orig_histo == NULL) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // Construct the histograms from backward references.
  HistogramBuild(xsize, histogram_bits, refs, orig_histo);
  HistogramCopyAndAnalyze(orig_histo, image_histo);
  entropy_combine =
      (image_histo->size > entropy_combine_num_bins * 2) && (quality < 100);

  if (entropy_combine) {
    const int32_t combine_cost_factor =
        GetCombineCostFactor(image_histo_raw_size, quality);

    HistogramAnalyzeEntropyBin(image_histo, low_effort);
    // Collapse histograms with similar entropy.
    HistogramCombineEntropyBin(image_histo, tmp_histo, entropy_combine_num_bins,
                               combine_cost_factor, low_effort);
  }

  // Don't combine the histograms using stochastic and greedy heuristics for
  // low-effort compression mode.
  if (!low_effort || !entropy_combine) {
    // cubic ramp between 1 and MAX_HISTO_GREEDY:
    const int threshold_size =
        (int)(1 + DivRound(quality * quality * quality * (MAX_HISTO_GREEDY - 1),
                           100 * 100 * 100));
    int do_greedy;
    if (!HistogramCombineStochastic(image_histo, threshold_size, &do_greedy)) {
      WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
      goto Error;
    }
    if (do_greedy) {
      if (!HistogramCombineGreedy(image_histo)) {
        WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }
    }
  }

  // Find the optimal map from original histograms to the final ones.
  HistogramRemap(orig_histo, image_histo, histogram_symbols);

  if (!WebPReportProgress(pic, *percent + percent_range, percent)) {
    goto Error;
  }

 Error:
  VP8LFreeHistogramSet(orig_histo);
  return (pic->error_code == VP8_ENC_OK);
}